

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O3

void Abc_NtkCollectNodesByArea(SC_Man *p,Abc_Ntk_t *pNtk)

{
  int v;
  int iVar1;
  Vec_Que_t *pVVar2;
  long *plVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  char *__function;
  long lVar6;
  char *__file;
  long lVar7;
  
  pVVar2 = p->vNodeByGain;
  if (pVVar2->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                  ,0x88,"int Vec_QueSize(Vec_Que_t *)");
  }
  if (pVVar2->nSize != 1) {
    __assert_fail("Vec_QueSize(p->vNodeByGain) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclDnsize.c"
                  ,0xb5,"void Abc_NtkCollectNodesByArea(SC_Man *, Abc_Ntk_t *)");
  }
  if (*pVVar2->pHeap != -1) {
    __assert_fail("p->pHeap[0] == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                  ,0x71,"void Vec_QueClear(Vec_Que_t *)");
  }
  pVVar2->nSize = 1;
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      plVar3 = (long *)pVVar5->pArray[lVar7];
      if (((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) &&
         (0 < *(int *)((long)plVar3 + 0x1c))) {
        v = (int)plVar3[2];
        lVar6 = (long)v;
        if (lVar6 < 0) {
LAB_003cc644:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        lVar4 = *(long *)(*plVar3 + 0x178);
        if (*(int *)(lVar4 + 4) <= v) goto LAB_003cc644;
        iVar1 = *(int *)(*(long *)(lVar4 + 8) + lVar6 * 4);
        if (((long)iVar1 < 0) ||
           (lVar4 = *(long *)(*plVar3 + 0x170), *(int *)(lVar4 + 100) <= iVar1)) {
          __file = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
          ;
          __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
LAB_003cc678:
          __assert_fail("i >= 0 && i < p->nSize",__file,0x184,__function);
        }
        if (p->vNode2Gain->nSize <= v) {
          __file = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
          ;
          __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
          goto LAB_003cc678;
        }
        p->vNode2Gain->pArray[lVar6] =
             *(float *)(*(long *)(*(long *)(lVar4 + 0x68) + (long)iVar1 * 8) + 0x18);
        Vec_QuePush(p->vNodeByGain,v);
        pVVar5 = pNtk->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Abc_NtkCollectNodesByArea( SC_Man * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Vec_QueSize(p->vNodeByGain) == 0 );
    Vec_QueClear( p->vNodeByGain );
    Abc_NtkForEachNode( pNtk, pObj, i )
    if ( Abc_ObjFaninNum(pObj) > 0 )
    {
        Vec_FltWriteEntry( p->vNode2Gain, Abc_ObjId(pObj), Abc_SclObjCell(pObj)->area );
        Vec_QuePush( p->vNodeByGain, Abc_ObjId(pObj) );
    }
}